

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O1

bool __thiscall AllDiffDomain<4>::check(AllDiffDomain<4> *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  void *__s;
  ulong uVar4;
  IntView<4> *pIVar5;
  ulong __n;
  bool bVar6;
  
  uVar1 = this->sz;
  __n = (ulong)uVar1;
  if (__n == 0) {
    bVar6 = true;
  }
  else {
    uVar3 = 0xffffffff;
    if (-1 < (int)uVar1) {
      uVar3 = uVar1;
    }
    __s = operator_new__((long)(int)uVar3);
    if (0 < (int)uVar1) {
      memset(__s,0,__n);
    }
    bVar6 = (int)uVar1 < 1;
    if (0 < (int)uVar1) {
      pIVar5 = this->x;
      uVar4 = 0;
      do {
        iVar2 = (&pIVar5->var->min)[(ulong)pIVar5->var->in_scip * 4].v;
        if (*(char *)((long)__s + (long)pIVar5->b + (long)iVar2) != '\0') {
          bVar6 = false;
          goto LAB_0015b7bc;
        }
        *(undefined1 *)((long)__s + (long)pIVar5->b + (long)iVar2) = 1;
        uVar4 = uVar4 + 1;
        pIVar5 = pIVar5 + 1;
      } while (__n != uVar4);
      bVar6 = __n <= uVar4;
    }
LAB_0015b7bc:
    operator_delete__(__s);
  }
  return bVar6;
}

Assistant:

bool check() override {
		if (sz == 0) {
			return true;
		}
		bool* taken = new bool[sz];
		//		bool taken[sz];
		for (int i = 0; i < sz; i++) {
			taken[i] = false;
		}
		for (int i = 0; i < sz; i++) {
			if (taken[x[i].getShadowVal()]) {
				delete[] taken;
				return false;
			}
			taken[x[i].getShadowVal()] = true;
		}
		delete[] taken;
		return true;
	}